

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O1

void __thiscall w3Module::read_section(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  code *pcVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  uint8_t *payload;
  string local_60;
  uint8_t *local_40;
  ulong local_38;
  
  payload = *cursor;
  bVar1 = ::read_varuint7(cursor,this->end);
  uVar5 = (uint)bVar1;
  if (0xb < bVar1) {
    StringFormat_abi_cxx11_
              (&local_60,"malformed line:%d id:%X payload:%p base:%p end:%p",0x296,(ulong)uVar5,
               payload,this->base,this->end);
    ThrowString(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  uVar7 = 0;
  printf("%s(%d) read_section offset:%lX\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x298,
         (long)*cursor - (long)this->base);
  uVar2 = ::read_varuint32(cursor,this->end);
  uVar8 = (ulong)uVar2;
  printf("%s payload_size:%lX\n","read_section",uVar8);
  payload = *cursor;
  uVar6 = (uint)bVar1;
  if (uVar5 == 0) {
    uVar2 = ::read_varuint32(cursor,this->end);
    uVar7 = (ulong)uVar2;
    local_40 = *cursor;
    if (this->end < local_40 + uVar2) {
      StringFormat_abi_cxx11_(&local_60,"malformed %d",0x2a4);
      ThrowString(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    local_40 = (uint8_t *)0x0;
  }
  if (this->end < payload + uVar8) {
    local_38 = uVar7;
    StringFormat_abi_cxx11_
              (&local_60,"malformed line:%d id:%X payload:%p payload_size:%lX base:%p end:%p",0x2a7,
               (ulong)uVar6,payload,uVar8,this->base,this->end);
    ThrowString(&local_60);
    uVar7 = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      uVar7 = local_38;
    }
  }
  printf("%s(%d) read_section offset:%lX\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2a9,
         (long)*cursor - (long)this->base);
  *cursor = payload + uVar8;
  if (bVar1 == 0) {
    if ((uint)uVar7 < 0x7fffffff) {
      printf("skipping custom section:.%.*s\n",uVar7 & 0xffffffff,local_40);
    }
  }
  else {
    printf("%s(%d)\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2b5
          );
    uVar3 = (ulong)(uVar6 * 0x50);
    *(uint *)((long)&this->sections[0].id + uVar3) = uVar6;
    *(uint8_t **)((long)&this->sections[0].name.data + uVar3) = local_40;
    *(ulong *)((long)&this->sections[0].name.size + uVar3) = uVar7 & 0xffffffff;
    *(ulong *)((long)&this->sections[0].payload_size + uVar3) = uVar8;
    *(uint8_t **)((long)&this->sections[0].payload + uVar3) = payload;
    printf("%s(%d) %d\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2be
           ,(ulong)uVar5);
    pcVar4 = (code *)section_traits[uVar6].read;
    plVar9 = (long *)((long)this->sections + *(long *)&section_traits[uVar6].field_0x8 + -0x58);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *plVar9 + -1);
    }
    (*pcVar4)(plVar9,&payload);
    if (payload != *cursor) {
      StringFormat_abi_cxx11_
                (&local_60,"failed to read section:%X payload:%p cursor:%p\n",(ulong)uVar5);
      ThrowString(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void w3Module::read_section (uint8_t** cursor)
{
    uint8_t* payload = *cursor;
    const uint32_t id = read_varuint7 (cursor);

    if (id > 11)
        ThrowString (StringFormat ("malformed line:%d id:%X payload:%p base:%p end:%p", __LINE__, id, payload, base, end)); // UNDONE context

    printf ("%s(%d) read_section offset:%" FORMAT_SIZE "X\n", __FILE__, __LINE__, (long_t)(*cursor - this->base));

    const size_t payload_size = read_varuint32 (cursor);
    printf ("%s payload_size:%" FORMAT_SIZE "X\n", __func__, (long_t)payload_size);
    payload = *cursor;
    uint32_t name_size = 0;
    PCH local_name = 0;
    if (id == 0)
    {
        name_size = read_varuint32 (cursor);
        local_name = (PCH)*cursor;
        if (local_name + name_size > (PCH)end)
            ThrowString (StringFormat ("malformed %d", __LINE__)); // UNDONE context (move to module or section)
    }
    if (payload + payload_size > end)
        ThrowString (StringFormat ("malformed line:%d id:%X payload:%p payload_size:%" FORMAT_SIZE "X base:%p end:%p", __LINE__, id, payload, (long_t)payload_size, base, end)); // UNDONE context

    printf ("%s(%d) read_section offset:%" FORMAT_SIZE "X\n", __FILE__, __LINE__, (long_t)(*cursor - this->base));

    *cursor = payload + payload_size;

    if (id == 0)
    {
        if (name_size < INT_MAX)
            printf ("skipping custom section:.%.*s\n", (int)name_size, local_name);
        // UNDONE custom sections
        return;
    }

    printf("%s(%d)\n", __FILE__, __LINE__);

    w3Section& section = sections [id];
    section.id = id;
    section.name.data = local_name;
    section.name.size = name_size;
    section.payload_size = payload_size;
    section.payload = payload;

    printf("%s(%d) %d\n", __FILE__, __LINE__, (int)id);
    //DebugBreak ();

    (this->*section_traits [id].read) (&payload);

    if (payload != *cursor)
        ThrowString (StringFormat ("failed to read section:%X payload:%p cursor:%p\n", id, payload, *cursor));
}